

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

golf_model_t *
golf_model_dynamic(vec_golf_group_t groups,vec_vec3_t positions,vec_vec3_t normals,
                  vec_vec2_t texcoords)

{
  golf_model_t *in_RDI;
  golf_model_t *model;
  golf_model_group_t *in_stack_00000008;
  
  (in_RDI->groups).data = in_stack_00000008;
  *(golf_model_group_t **)&(in_RDI->groups).length = groups.data;
  (in_RDI->groups).alloc_category = (char *)groups._8_8_;
  (in_RDI->positions).data = (vec3 *)groups.alloc_category;
  *(vec3 **)&(in_RDI->positions).length = positions.data;
  (in_RDI->positions).alloc_category = (char *)positions._8_8_;
  (in_RDI->normals).data = (vec3 *)positions.alloc_category;
  *(vec3 **)&(in_RDI->normals).length = normals.data;
  (in_RDI->normals).alloc_category = (char *)normals._8_8_;
  (in_RDI->texcoords).data = (vec2 *)normals.alloc_category;
  *(vec2 **)&(in_RDI->texcoords).length = texcoords.data;
  (in_RDI->texcoords).alloc_category = (char *)texcoords._8_8_;
  in_RDI->is_water = false;
  in_RDI->sg_size = 0;
  return in_RDI;
}

Assistant:

golf_model_t golf_model_dynamic(vec_golf_group_t groups, vec_vec3_t positions, vec_vec3_t normals, vec_vec2_t texcoords) {
    golf_model_t model;
    model.groups = groups;
    model.positions = positions;
    model.normals = normals;
    model.texcoords = texcoords;
    model.is_water = false;
    model.sg_size = 0;
    return model;
}